

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writing_persistence_to_file.h
# Opt level: O1

ostream * Gudhi::operator<<(ostream *out,Persistence_interval_common<double,_int> *it)

{
  ostream *poVar1;
  
  if (it->arith_element_ != 0x7fffffff) {
    poVar1 = (ostream *)std::ostream::operator<<(out,it->arith_element_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
  }
  if (it->dimension_ != 0xffffffff) {
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  }
  poVar1 = std::ostream::_M_insert<double>(it->birth_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<double>(it->death_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Persistence_interval_common& it) {
    if (it.arith_element_ != std::numeric_limits<Coefficient_field>::max()) {
      out << it.arith_element_ << "  ";
    }
    if (it.dimension_ != std::numeric_limits<unsigned>::max()) {
      out << it.dimension_ << " ";
    }
    out << it.birth_ << " " << it.death_ << " ";
    return out;
  }